

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertDoublesEqual
          (UtestShell *this,double expected,double actual,double threshold,char *text,char *fileName
          ,size_t lineNumber,TestTerminator *testTerminator)

{
  bool bVar1;
  TestResult *pTVar2;
  SimpleString *in_RDX;
  long *in_RDI;
  undefined8 in_R8;
  UtestShell *in_stack_fffffffffffffef8;
  double in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  undefined1 local_a8 [16];
  SimpleString *in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  UtestShell *in_stack_ffffffffffffff98;
  DoublesEqualFailure *in_stack_ffffffffffffffa0;
  
  pTVar2 = getTestResult(in_stack_fffffffffffffef8);
  (*pTVar2->_vptr_TestResult[10])();
  bVar1 = doubles_equal(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                        (double)in_stack_fffffffffffffef8);
  if (!bVar1) {
    SimpleString::SimpleString(in_RDX,(char *)in_stack_fffffffffffffef8);
    DoublesEqualFailure::DoublesEqualFailure
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    (**(code **)(*in_RDI + 0x138))(in_RDI,local_a8,in_R8);
    DoublesEqualFailure::~DoublesEqualFailure((DoublesEqualFailure *)0x123317);
    SimpleString::~SimpleString((SimpleString *)0x123321);
  }
  return;
}

Assistant:

void UtestShell::assertDoublesEqual(double expected, double actual, double threshold, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (!doubles_equal(expected, actual, threshold))
        failWith(DoublesEqualFailure(this, fileName, lineNumber, expected, actual, threshold, text), testTerminator);
}